

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression * slang::ast::AssertionInstanceExpression::makeDefault(Symbol *symbol)

{
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  bitmask<slang::ast::ASTFlags> extraFlags;
  Symbol **__x;
  bool bVar1;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> _Var2;
  int iVar3;
  reference ppAVar4;
  equal_to<const_slang::ast::Symbol_*> *this;
  raw_key_type *__y;
  Symbol *args_1;
  AssertionExpr *args_2;
  SourceLocation endLoc;
  AssertionInstanceExpression *pAVar5;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  AssertionInstanceDetails *extraout_RDX;
  Symbol *in_RDI;
  LookupLocation LVar6;
  AssertionInstanceExpression *result;
  SourceRange range;
  AssertionExpr *body;
  SmallVector<const_slang::ast::Symbol_*,_5UL> localVars;
  SyntaxNode *bodySyntax;
  ASTContext bodyContext;
  ActualArg arg;
  PropertyExprSyntax *expr;
  ASTContext ctx;
  AssertionPortSymbol *formal;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *__range2;
  SourceLocation outputLocalVarArgLoc;
  AssertionInstanceDetails instance;
  LetDeclSymbol *let;
  PropertySymbol *prop;
  SequenceSymbol *seq;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> formalPorts;
  Scope *symbolScope;
  Type *type;
  Compilation *comp;
  ASTContext context;
  Scope *parentScope;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x_1;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  Symbol **k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  Symbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>
  *in_stack_fffffffffffff778;
  AssertionInstanceDetails *in_stack_fffffffffffff780;
  ASTContext *in_stack_fffffffffffff788;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff790;
  AssertionInstanceExpression *this_00;
  Scope *in_stack_fffffffffffff798;
  AssertionInstanceDetails *in_stack_fffffffffffff7a0;
  SmallVectorBase<const_slang::ast::Symbol_*> *args_3;
  size_t in_stack_fffffffffffff7a8;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  *in_stack_fffffffffffff7b0;
  Type *in_stack_fffffffffffff7b8;
  BumpAllocator *in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7c8;
  SyntaxKind typeKind;
  Compilation *in_stack_fffffffffffff7d0;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> local_814;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> local_812;
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
  *in_stack_fffffffffffff7f0;
  undefined7 in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff7ff;
  equal_to<const_slang::ast::Symbol_*> *in_stack_fffffffffffff800;
  Symbol **in_stack_fffffffffffff808;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  *in_stack_fffffffffffff810;
  SourceLocation in_stack_fffffffffffff830;
  SourceLocation SVar7;
  AssertionInstanceDetails *in_stack_fffffffffffff838;
  ASTContext *in_stack_fffffffffffff840;
  SourceLocation in_stack_fffffffffffff848;
  Symbol *in_stack_fffffffffffff850;
  SourceLocation in_stack_fffffffffffff858;
  Scope *local_708;
  Scope *local_6f8;
  Scope *local_6e8;
  undefined1 *puVar8;
  undefined4 in_stack_fffffffffffff930;
  SymbolKind SVar9;
  Type *in_stack_fffffffffffff938;
  AssertionPortSymbol *in_stack_fffffffffffff940;
  PropertyExprSyntax *in_stack_fffffffffffff948;
  Compilation *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  SourceRange local_688;
  SourceLocation local_678;
  AssertionExpr *local_670;
  SmallVectorBase<const_slang::ast::Symbol_*> local_668 [2];
  Symbol *local_628;
  undefined4 local_61c;
  bitmask<slang::ast::ASTFlags> local_618;
  bitmask<slang::ast::ASTFlags> local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  Symbol **local_5c8;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined1 local_5b8 [40];
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> local_590 [4];
  PropertyExprSyntax *local_550;
  Symbol local_548;
  bitmask<slang::ast::ASTFlags> local_508 [4];
  Symbol **local_4e8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_4e0;
  undefined8 local_4c8;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> local_4c0 [4];
  AssertionPortSymbol *local_480;
  AssertionPortSymbol **local_478;
  __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
  local_470;
  pointer *local_468;
  SourceLocation local_450;
  Symbol *local_448;
  undefined1 *local_440;
  SourceLocation local_438;
  undefined1 local_430 [8];
  size_t local_428;
  ulong local_410;
  ulong local_408;
  LetDeclSymbol *local_3b8;
  PropertySymbol *local_3b0;
  SequenceSymbol *local_3a8;
  pointer local_3a0;
  size_t local_398;
  Scope *local_390;
  Type *local_388;
  Compilation *local_380;
  bitmask<slang::ast::ASTFlags> local_378;
  Scope *local_370;
  uint32_t local_368;
  Scope *local_360;
  uint32_t local_358;
  undefined1 local_350 [56];
  Scope *local_318;
  Symbol *local_310;
  AssertionInstanceExpression *local_308;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *local_300;
  AssertionPortSymbol **local_2f8;
  SourceLocation local_2f0;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *local_2e8;
  AssertionPortSymbol **local_2e0;
  undefined1 *local_2d8;
  undefined1 local_2b9 [17];
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *local_2a8;
  AssertionPortSymbol **local_2a0;
  SourceLocation local_298;
  bool local_289 [25];
  iterator local_270;
  bool local_259 [25];
  iterator local_240;
  bool local_229;
  iterator local_228;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  local_218;
  size_t local_200;
  AssertionInstanceDetails *local_1f8;
  Symbol **local_1f0;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *local_1e8;
  ASTContext *local_1e0;
  undefined1 *local_1d8;
  SourceLocation local_1d0;
  uint local_1c4;
  value_type *local_1c0;
  value_type *local_1b8;
  uint local_1ac;
  group_type *local_1a8;
  size_t local_1a0;
  pow2_quadratic_prober local_198;
  AssertionInstanceDetails *local_188;
  size_t local_180;
  Symbol **local_178;
  SourceLocation local_170;
  undefined1 local_151 [17];
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *local_140;
  AssertionPortSymbol **local_138;
  undefined1 *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  local_b0;
  size_t local_98;
  size_t local_90;
  Symbol **local_88;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *local_80;
  key_type *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Symbol **local_10;
  undefined1 *local_8;
  
  typeKind = (SyntaxKind)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  local_310 = in_RDI;
  local_318 = Symbol::getParentScope(in_RDI);
  LVar6 = LookupLocation::before((Symbol *)in_stack_fffffffffffff780);
  local_370 = LVar6.scope;
  local_368 = LVar6.index;
  local_360 = local_370;
  local_358 = local_368;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_378,None);
  puVar8 = local_350;
  LVar6._8_8_ = in_stack_fffffffffffff7a0;
  LVar6.scope = in_stack_fffffffffffff798;
  ASTContext::ASTContext
            (in_stack_fffffffffffff788,(Scope *)in_stack_fffffffffffff780,LVar6,
             in_stack_fffffffffffff790);
  local_380 = ASTContext::getCompilation((ASTContext *)0xb95322);
  std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)0xb95337)
  ;
  SVar9 = local_310->kind;
  if (SVar9 == Sequence) {
    local_3a8 = Symbol::as<slang::ast::SequenceSymbol>((Symbol *)0xb95373);
    local_388 = Compilation::getType(in_stack_fffffffffffff7d0,typeKind);
    local_3a0 = (local_3a8->ports)._M_ptr;
    local_398 = (local_3a8->ports)._M_extent._M_extent_value;
    local_6e8 = (Scope *)0x0;
    if (local_3a8 != (SequenceSymbol *)0x0) {
      local_6e8 = &local_3a8->super_Scope;
    }
    local_390 = local_6e8;
  }
  else if (SVar9 == Property) {
    local_3b0 = Symbol::as<slang::ast::PropertySymbol>((Symbol *)0xb9540e);
    local_388 = Compilation::getType(in_stack_fffffffffffff7d0,typeKind);
    local_3a0 = (local_3b0->ports)._M_ptr;
    local_398 = (local_3b0->ports)._M_extent._M_extent_value;
    local_6f8 = (Scope *)0x0;
    if (local_3b0 != (PropertySymbol *)0x0) {
      local_6f8 = &local_3b0->super_Scope;
    }
    local_390 = local_6f8;
  }
  else {
    local_3b8 = Symbol::as<slang::ast::LetDeclSymbol>((Symbol *)0xb954a9);
    local_388 = Compilation::getVoidType(local_380);
    local_3a0 = (local_3b8->ports)._M_ptr;
    local_398 = (local_3b8->ports)._M_extent._M_extent_value;
    local_708 = (Scope *)0x0;
    if (local_3b8 != (LetDeclSymbol *)0x0) {
      local_708 = &local_3b8->super_Scope;
    }
    local_390 = local_708;
  }
  AssertionInstanceDetails::AssertionInstanceDetails(in_stack_fffffffffffff7a0);
  local_448 = local_310;
  local_440 = local_350;
  local_438 = local_310->location;
  SourceLocation::SourceLocation(&local_450);
  local_468 = &local_3a0;
  local_470._M_current =
       (AssertionPortSymbol **)
       std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffff778);
  local_478 = (AssertionPortSymbol **)
              std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>
                          *)in_stack_fffffffffffff788);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff780,
                       (__normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff778);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_608 = LookupLocation::max;
      uStack_600 = DAT_00fffd90;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_610,None);
      lookupLocation_00._8_8_ = in_stack_fffffffffffff7a0;
      lookupLocation_00.scope = in_stack_fffffffffffff798;
      ASTContext::ASTContext
                (in_stack_fffffffffffff788,(Scope *)in_stack_fffffffffffff780,lookupLocation_00,
                 in_stack_fffffffffffff790);
      local_5c8 = &local_448;
      if (local_310->kind == LetDecl) {
        Symbol::as<slang::ast::LetDeclSymbol>((Symbol *)0xb964f6);
        not_null<const_slang::syntax::ExpressionSyntax_*>::operator*
                  ((not_null<const_slang::syntax::ExpressionSyntax_*> *)0xb9650e);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_618,None);
        extraFlags.m_bits._7_1_ = in_stack_fffffffffffff95f;
        extraFlags.m_bits._0_7_ = in_stack_fffffffffffff958;
        local_308 = (AssertionInstanceExpression *)
                    Expression::create(in_stack_fffffffffffff950,
                                       (ExpressionSyntax *)in_stack_fffffffffffff948,
                                       (ASTContext *)in_stack_fffffffffffff940,extraFlags,
                                       in_stack_fffffffffffff938);
        local_61c = 1;
      }
      else {
        args_1 = (Symbol *)Symbol::getSyntax(local_310);
        iVar3 = (int)((ulong)in_stack_fffffffffffff780 >> 0x20);
        args_3 = local_668;
        local_628 = args_1;
        SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0xb965aa);
        local_678 = local_450;
        args_2 = bindAssertionBody(in_stack_fffffffffffff850,(SyntaxNode *)in_stack_fffffffffffff848
                                   ,in_stack_fffffffffffff840,in_stack_fffffffffffff858,
                                   in_stack_fffffffffffff838,
                                   (SmallVectorBase<const_slang::ast::Symbol_*> *)
                                   in_stack_fffffffffffff830);
        SVar7 = local_310->location;
        local_670 = args_2;
        endLoc = SourceLocation::operator+<int>((SourceLocation *)in_stack_fffffffffffff788,iVar3);
        SourceRange::SourceRange(&local_688,SVar7,endLoc);
        pAVar5 = BumpAllocator::
                 emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                           (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,args_1,args_2,
                            (bool *)args_3,(SourceRange *)endLoc);
        this_00 = pAVar5;
        iVar3 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                          (local_668,(EVP_PKEY_CTX *)local_380,src);
        in_stack_fffffffffffff780 = extraout_RDX;
        std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::
        span<const_slang::ast::Symbol_*,_18446744073709551615UL>
                  ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)this_00,
                   (span<const_slang::ast::Symbol_*,_18446744073709551615UL> *)
                   CONCAT44(extraout_var,iVar3));
        (pAVar5->localVars)._M_ptr = (pointer)in_stack_fffffffffffff948;
        (pAVar5->localVars)._M_extent._M_extent_value = (size_t)in_stack_fffffffffffff950;
        local_61c = 1;
        local_308 = pAVar5;
        SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0xb96746);
      }
      AssertionInstanceDetails::~AssertionInstanceDetails(in_stack_fffffffffffff780);
      return &local_308->super_Expression;
    }
    ppAVar4 = __gnu_cxx::
              __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_470);
    local_480 = *ppAVar4;
    if (local_480->defaultValueSyntax == (PropertyExprSyntax *)0x0) {
      local_4c8 = 0;
      std::make_tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext&>
                ((PropertyExprSyntax **)in_stack_fffffffffffff788,
                 (ASTContext *)in_stack_fffffffffffff780);
      local_2e0 = &local_480;
      local_2e8 = local_4c0;
      local_2d8 = local_430;
      local_140 = local_2e8;
      local_138 = local_2e0;
      local_130 = local_430;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
      ::al((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            *)0xb956b7);
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
      ::alloc_cted_or_fwded_key_type
                ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                  *)in_stack_fffffffffffff780,
                 (allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
                  *)in_stack_fffffffffffff778,(AssertionPortSymbol **)0xb956cf);
      local_78 = boost::unordered::detail::foa::
                 alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                 ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                                *)0xb956de);
      local_70 = local_151;
      local_80 = local_140;
      local_68 = local_430;
      local_88 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                 ::
                 key_from<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                           (local_78,local_140);
      local_90 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                 ::hash_for<slang::ast::Symbol_const*>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                             *)in_stack_fffffffffffff780,(Symbol **)in_stack_fffffffffffff778);
      local_98 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                 *)in_stack_fffffffffffff780,(size_t)in_stack_fffffffffffff778);
      local_10 = local_88;
      local_20 = local_90;
      local_18 = local_98;
      local_8 = local_430;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_98);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                             *)0xb9583a);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff788,(size_t)in_stack_fffffffffffff780);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                     ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                 *)0xb95898);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            this = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                           *)0xb958eb);
            __x = local_10;
            __y = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                  ::
                  key_from<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                            ((pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
                              *)0xb9591f);
            bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()(this,__x,__y);
            if (bVar1) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_00b95a3b;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar1 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff780,(size_t)in_stack_fffffffffffff778);
        if (bVar1) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
          ::table_locator(&local_b0);
          goto LAB_00b95a3b;
        }
        bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,local_428);
      } while (bVar1);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
      ::table_locator(&local_b0);
LAB_00b95a3b:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_b0);
      if (bVar1) {
        local_c0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::make_iterator((locator *)0xb95a5b);
        local_c1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_4e0,&local_c0,&local_c1);
      }
      else if (local_408 < local_410) {
        in_stack_fffffffffffff778 = local_80;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                  (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                   (size_t)in_stack_fffffffffffff7a0,(try_emplace_args_t *)in_stack_fffffffffffff798
                   ,(Symbol **)in_stack_fffffffffffff790.m_bits,
                   (tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   in_stack_fffffffffffff7c0);
        local_d8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::make_iterator((locator *)0xb95afd);
        local_f1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_4e0,&local_d8,local_f1);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                  (in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808,
                   (try_emplace_args_t *)in_stack_fffffffffffff800,
                   (Symbol **)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                   (tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   in_stack_fffffffffffff7f0);
        local_108 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    ::make_iterator((locator *)0xb95b78);
        local_121[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_4e0,&local_108,local_121);
      }
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
      ::~alloc_cted_or_fwded_key_type
                ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                  *)0xb95bfd);
    }
    else {
      LVar6 = LookupLocation::after((Symbol *)in_stack_fffffffffffff780);
      local_548.name._M_str = (char *)LVar6.scope;
      local_548.location._0_4_ = LVar6.index;
      local_548.parentScope = (Scope *)local_548.name._M_str;
      local_548.nextInScope._0_4_ = local_548.location._0_4_;
      bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&local_548.name,None);
      lookupLocation._8_8_ = in_stack_fffffffffffff7a0;
      lookupLocation.scope = in_stack_fffffffffffff798;
      ASTContext::ASTContext
                (in_stack_fffffffffffff788,(Scope *)in_stack_fffffffffffff780,lookupLocation,
                 in_stack_fffffffffffff790);
      local_4e8 = &local_448;
      in_stack_fffffffffffff850 = &local_548;
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff850,AssertionDefaultArg);
      bitmask<slang::ast::ASTFlags>::operator|=
                (local_508,(bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff850);
      local_550 = local_480->defaultValueSyntax;
      SVar7 = (SourceLocation)local_430;
      std::make_tuple<slang::syntax::PropertyExprSyntax_const*&,slang::ast::ASTContext&>
                ((PropertyExprSyntax **)in_stack_fffffffffffff788,
                 (ASTContext *)in_stack_fffffffffffff780);
      local_2f8 = &local_480;
      local_300 = local_590;
      in_stack_fffffffffffff858 = SVar7;
      local_2f0 = SVar7;
      local_2a8 = local_300;
      local_2a0 = local_2f8;
      local_298 = SVar7;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
      ::al((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            *)0xb95e05);
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
      ::alloc_cted_or_fwded_key_type
                ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                  *)in_stack_fffffffffffff780,
                 (allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
                  *)in_stack_fffffffffffff778,(AssertionPortSymbol **)0xb95e1d);
      in_stack_fffffffffffff840 =
           (ASTContext *)
           boost::unordered::detail::foa::
           alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
           ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                          *)0xb95e2c);
      local_1d8 = local_2b9;
      local_1e8 = local_2a8;
      in_stack_fffffffffffff848 = SVar7;
      local_1e0 = in_stack_fffffffffffff840;
      local_1d0 = SVar7;
      local_1f0 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                  ::
                  key_from<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                            (in_stack_fffffffffffff840,local_2a8);
      in_stack_fffffffffffff838 =
           (AssertionInstanceDetails *)
           boost::unordered::detail::foa::
           table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
           ::hash_for<slang::ast::Symbol_const*>
                     ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                       *)in_stack_fffffffffffff780,(Symbol **)in_stack_fffffffffffff778);
      local_1f8 = in_stack_fffffffffffff838;
      local_200 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                  *)in_stack_fffffffffffff780,(size_t)in_stack_fffffffffffff778);
      local_178 = local_1f0;
      local_188 = local_1f8;
      in_stack_fffffffffffff830 = SVar7;
      local_180 = local_200;
      local_170 = SVar7;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_198,local_200);
      do {
        local_1a0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_198);
        local_1a8 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                              *)0xb95f88);
        local_1a8 = local_1a8 + local_1a0;
        local_1ac = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff788,(size_t)in_stack_fffffffffffff780);
        if (local_1ac != 0) {
          local_1b8 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                      ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                  *)0xb95fe6);
          local_1c0 = local_1b8 + local_1a0 * 0xf;
          do {
            local_1c4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffff800 =
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                         *)0xb96039);
            in_stack_fffffffffffff808 = local_178;
            in_stack_fffffffffffff810 =
                 (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  *)boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                    ::
                    key_from<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                              ((pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
                                *)0xb9606d);
            bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                              (in_stack_fffffffffffff800,in_stack_fffffffffffff808,
                               (Symbol **)in_stack_fffffffffffff810);
            if (bVar1) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
              ::table_locator(&local_218,local_1a8,local_1c4,local_1c0 + local_1c4);
              goto LAB_00b96189;
            }
            local_1ac = local_1ac - 1 & local_1ac;
          } while (local_1ac != 0);
        }
        in_stack_fffffffffffff7ff =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff780,(size_t)in_stack_fffffffffffff778);
        if ((bool)in_stack_fffffffffffff7ff) {
          memset(&local_218,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
          ::table_locator(&local_218);
          goto LAB_00b96189;
        }
        bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_198,*(size_type *)((long)SVar7 + 8));
      } while (bVar1);
      memset(&local_218,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
      ::table_locator(&local_218);
LAB_00b96189:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_218);
      if (bVar1) {
        local_228 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    ::make_iterator((locator *)0xb961ab);
        local_229 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    *)(local_5b8 + 0x10),&local_228,&local_229);
      }
      else if (*(pointer *)((long)in_stack_fffffffffffff830 + 0x28) <
               ((SmallVectorBase<const_slang::ast::Symbol_*> *)
               ((long)in_stack_fffffffffffff830 + 0x20))->data_) {
        in_stack_fffffffffffff778 = local_1e8;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                  (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                   (size_t)in_stack_fffffffffffff7a0,(try_emplace_args_t *)in_stack_fffffffffffff798
                   ,(Symbol **)in_stack_fffffffffffff790.m_bits,
                   (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   in_stack_fffffffffffff7c0);
        local_240 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    ::make_iterator((locator *)0xb9624d);
        local_259[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    *)(local_5b8 + 0x10),&local_240,local_259);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                  (in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808,
                   (try_emplace_args_t *)in_stack_fffffffffffff800,
                   (Symbol **)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                   in_stack_fffffffffffff7f0);
        local_270 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    ::make_iterator((locator *)0xb962c8);
        local_289[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    *)(local_5b8 + 0x10),&local_270,local_289);
      }
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
      ::~alloc_cted_or_fwded_key_type
                ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
                  *)0xb96350);
      in_stack_fffffffffffff7f0 =
           (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)local_5b8;
      std::
      variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      ::variant((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                 *)0xb96364);
      checkAssertionArg(in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                        (ASTContext *)in_stack_fffffffffffff938,
                        (ActualArg *)CONCAT44(SVar9,in_stack_fffffffffffff930),
                        SUB81((ulong)puVar8 >> 0x38,0));
    }
    bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xb9639a);
    local_812 = false;
    if (!bVar1) {
      local_5bc = 2;
      _Var2 = std::operator==((optional<slang::ast::ArgumentDirection> *)in_stack_fffffffffffff780,
                              (ArgumentDirection *)in_stack_fffffffffffff778);
      local_814 = true;
      if (!_Var2) {
        local_5c0 = 1;
        local_814 = std::operator==((optional<slang::ast::ArgumentDirection> *)
                                    in_stack_fffffffffffff780,
                                    (ArgumentDirection *)in_stack_fffffffffffff778);
      }
      local_812 = local_814;
    }
    if (local_812 != false) {
      local_450 = (local_480->super_Symbol).location;
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::AssertionPortSymbol_*const_*,_std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_470);
  } while( true );
}

Assistant:

Expression& AssertionInstanceExpression::makeDefault(const Symbol& symbol) {
    auto parentScope = symbol.getParentScope();
    SLANG_ASSERT(parentScope);

    ASTContext context(*parentScope, LookupLocation::before(symbol));
    auto& comp = context.getCompilation();
    const Type* type;
    const Scope* symbolScope;
    std::span<const AssertionPortSymbol* const> formalPorts;

    switch (symbol.kind) {
        case SymbolKind::Sequence: {
            auto& seq = symbol.as<SequenceSymbol>();
            type = &comp.getType(SyntaxKind::SequenceType);
            formalPorts = seq.ports;
            symbolScope = &seq;
            break;
        }
        case SymbolKind::Property: {
            auto& prop = symbol.as<PropertySymbol>();
            type = &comp.getType(SyntaxKind::PropertyType);
            formalPorts = prop.ports;
            symbolScope = &prop;
            break;
        }
        case SymbolKind::LetDecl: {
            auto& let = symbol.as<LetDeclSymbol>();
            type = &comp.getVoidType();
            formalPorts = let.ports;
            symbolScope = &let;
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }

    AssertionInstanceDetails instance;
    instance.symbol = &symbol;
    instance.prevContext = &context;
    instance.instanceLoc = symbol.location;

    // Bind default args, make placeholder entries for args that don't have defaults.
    SourceLocation outputLocalVarArgLoc;
    for (auto formal : formalPorts) {
        if (!formal->defaultValueSyntax) {
            instance.argumentMap.emplace(formal,
                                         std::make_tuple((PropertyExprSyntax*)nullptr, context));
        }
        else {
            ASTContext ctx(*symbolScope, LookupLocation::after(*formal));
            ctx.assertionInstance = &instance;
            ctx.flags |= ASTFlags::AssertionDefaultArg;

            auto expr = formal->defaultValueSyntax;
            instance.argumentMap.emplace(formal, std::make_tuple(expr, ctx));

            ActualArg arg;
            checkAssertionArg(*expr, *formal, ctx, arg, false);
        }

        if (!outputLocalVarArgLoc && (formal->direction == ArgumentDirection::InOut ||
                                      formal->direction == ArgumentDirection::Out)) {
            outputLocalVarArgLoc = formal->location;
        }
    }

    ASTContext bodyContext(*symbolScope, LookupLocation::max);
    bodyContext.assertionInstance = &instance;

    // Let declarations expand directly to an expression.
    if (symbol.kind == SymbolKind::LetDecl)
        return create(comp, *symbol.as<LetDeclSymbol>().exprSyntax, bodyContext);

    auto bodySyntax = symbol.getSyntax();
    SLANG_ASSERT(bodySyntax);

    SmallVector<const Symbol*> localVars;
    auto& body = bindAssertionBody(symbol, *bodySyntax, bodyContext, outputLocalVarArgLoc, instance,
                                   localVars);

    SourceRange range{symbol.location, symbol.location + 1};
    auto result = comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                            /* isRecursiveProperty */ false, range);
    result->localVars = localVars.copy(comp);
    return *result;
}